

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

void __thiscall glu::Program::Program(Program *this,Functions *gl)

{
  GLuint GVar1;
  GLenum err;
  Functions *gl_local;
  Program *this_local;
  
  this->m_gl = gl;
  this->m_program = 0;
  ProgramInfo::ProgramInfo(&this->m_info);
  GVar1 = (*this->m_gl->createProgram)();
  this->m_program = GVar1;
  err = (*this->m_gl->getError)();
  checkError(err,"glCreateProgram()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0xbc);
  return;
}

Assistant:

Program::Program (const glw::Functions& gl)
	: m_gl		(gl)
	, m_program	(0)
{
	m_program = m_gl.createProgram();
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateProgram()");
}